

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

OwnPromiseNode kj::_::readyNow(void)

{
  PromiseNode *in_RDI;
  
  if (readyNow()::NODE == '\0') {
    readyNow();
  }
  (in_RDI->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)&readyNow::NODE;
  return (OwnPromiseNode)in_RDI;
}

Assistant:

OwnPromiseNode readyNow() {
  class ReadyNowPromiseNode: public ImmediatePromiseNodeBase {
    // This is like `ConstPromiseNode<Void, Void{}>`, but the compiler won't let me pass a literal
    // value of type `Void` as a template parameter. (Might require C++20?)

  public:
    void destroy() override {}
    void get(ExceptionOrValue& output) noexcept override {
      output.as<Void>() = Void();
    }
  };

  static ReadyNowPromiseNode NODE;
  return OwnPromiseNode(&NODE);
}